

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ** __thiscall
google::protobuf::internal::GeneratedMessageReflection::DefaultRaw<std::__cxx11::string_const*>
          (GeneratedMessageReflection *this,FieldDescriptor *field)

{
  long *plVar1;
  
  if (field[0x34] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x38) + 0x30);
  }
  else if (*(long *)(field + 0x40) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x20) + 0x80);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x40) + 0x70);
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((long)&(this->default_instance_->super_MessageLite)._vptr_MessageLite +
         (long)this->offsets_[(int)((ulong)((long)field - *plVar1) >> 3) * -0x11111111]);
}

Assistant:

inline const Type& GeneratedMessageReflection::DefaultRaw(
    const FieldDescriptor* field) const {
  const void* ptr = reinterpret_cast<const uint8*>(default_instance_) +
                    offsets_[field->index()];
  return *reinterpret_cast<const Type*>(ptr);
}